

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O3

void __thiscall
QByteArrayMatcher::QByteArrayMatcher(QByteArrayMatcher *this,QByteArrayMatcher *other)

{
  (this->q_pattern).d.ptr = (char *)0x0;
  (this->q_pattern).d.size = 0;
  this->d = (QByteArrayMatcherPrivate *)0x0;
  (this->q_pattern).d.d = (Data *)0x0;
  QByteArray::operator=(&this->q_pattern,&other->q_pattern);
  memcpy(&this->field_2,&other->field_2,0x110);
  return;
}

Assistant:

QByteArrayMatcher::QByteArrayMatcher(const QByteArrayMatcher &other)
    : d(nullptr)
{
    operator=(other);
}